

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmax_distance.cpp
# Opt level: O2

void __thiscall
KMaxDistance::addFurtherPathToNodeAVL
          (KMaxDistance *this,MaxRec *srcRec,int idxOfDstPix,double edgeCost,int numDistMaxs,
          MaxRec **maxs,NodeAVL **queue)

{
  MaxRec *nodeRec;
  int iVar1;
  MaxRec *dst;
  NodeAVL *pNVar2;
  long lVar3;
  KMaxDistance *pKVar4;
  int numRecsToOverwrite;
  double local_3ec0;
  MaxRec *recsToOverWrite [2000];
  
  nodeRec = maxs[idxOfDstPix];
  pKVar4 = this;
  local_3ec0 = edgeCost;
  dst = createNewMaxRec(this,nodeRec->imgIdx,numDistMaxs);
  dst->back = srcRec;
  copyVals(pKVar4,srcRec,dst);
  modifyDstMaxs(pKVar4,dst,local_3ec0);
  pKVar4 = this;
  iVar1 = compareVecOfMaxsWithAllVecsInNode(this,dst,nodeRec,recsToOverWrite,&numRecsToOverwrite);
  if (iVar1 == 3) {
    dst->next = maxs[nodeRec->imgIdx];
    pNVar2 = avlInsert(queue,dst->sumVals,dst);
    dst->qPtr = pNVar2;
    maxs[nodeRec->imgIdx] = dst;
  }
  else if (iVar1 == 2) {
    recsToOverWrite[0]->back = srcRec;
    copyVals(pKVar4,dst,recsToOverWrite[0]);
    if (recsToOverWrite[0]->wasMin == 0) {
      avlUpdateNode(queue,recsToOverWrite[0]->qPtr,recsToOverWrite[0]->sumVals);
    }
    else {
      pNVar2 = avlInsert(queue,recsToOverWrite[0]->sumVals,recsToOverWrite[0]);
      recsToOverWrite[0]->qPtr = pNVar2;
    }
    free(dst);
    iVar1 = this->numMaxRecs;
    for (lVar3 = 1; lVar3 < numRecsToOverwrite; lVar3 = lVar3 + 1) {
      recsToOverWrite[lVar3]->isUsed = 0;
    }
    this->numMaxRecs = iVar1 - numRecsToOverwrite;
  }
  else {
    free(dst);
    this->numMaxRecs = this->numMaxRecs + -1;
  }
  return;
}

Assistant:

void KMaxDistance::addFurtherPathToNodeAVL( MaxRec *srcRec, const int idxOfDstPix, const double edgeCost,
    const int numDistMaxs, MaxRec **maxs, NodeAVL **queue ){

    MaxRec *dstRec = maxs[idxOfDstPix];

    MaxRec *tmpRec = (MaxRec*)createNewMaxRec( dstRec->imgIdx, numDistMaxs );

    //tmpRec->back = srcRec->imgIdx;
    tmpRec->back = srcRec;
    copyVals( srcRec, tmpRec );
    modifyDstMaxs( tmpRec, edgeCost );
    //printRec( "modif: ", tmpRec, numDistMaxsGl );

    int numRecsToOverwrite;
    MaxRec* recsToOverWrite[MAX_NUM_TO_OVERWRITE];
    int compare = compareVecOfMaxsWithAllVecsInNode( tmpRec, dstRec, recsToOverWrite, &numRecsToOverwrite );
    MaxRec* recToOverWrite;
    //printf( "compare=%d\n", compare );

    switch ( compare ){

      case 2: recToOverWrite = recsToOverWrite[0];
              //recToOverWrite->back = srcRec->imgIdx;
              recToOverWrite->back = srcRec;
              copyVals( tmpRec, recToOverWrite );
              if ( recToOverWrite->wasMin ) recToOverWrite->qPtr = avlInsert( queue, recToOverWrite->sumVals, recToOverWrite );
              else avlUpdateNode( queue, recToOverWrite->qPtr, recToOverWrite->sumVals );
              free( tmpRec ); numMaxRecs--;
              for ( int i = 1; i < numRecsToOverwrite; ++i ) 
              {
                  recsToOverWrite[i]->isUsed = 0;
                  //MaxRec* prec = (MaxRec*)recsToOverWrite[i]->prev;
                  //MaxRec* nrec = (MaxRec*)recsToOverWrite[i]->next;
                  //if(prec != NULL) prec->next = nrec;
                  //if(nrec != NULL) nrec->prev = prec;
                  //free(recsToOverWrite[i]);
              }
              numMaxRecs = numMaxRecs - numRecsToOverwrite + 1;
              break;

      case 3:
              tmpRec->next = maxs[dstRec->imgIdx];
              //maxs[dstRec->imgIdx]->prev = tmpRec;
              tmpRec->qPtr = avlInsert( queue, tmpRec->sumVals, tmpRec );
              maxs[dstRec->imgIdx] = tmpRec;
              break;

      default: free( tmpRec ); numMaxRecs--; break;

    }
    
    #ifdef DEBUG_MODE
    int cnt = getNumMaxRecs( maxs[idxOfDstPix] );
    if ( cnt > numMaxRecsInOneNode ) numMaxRecsInOneNode = cnt;
    #endif

    #ifdef CHECK_NODES
    MaxRec *iRec = maxs[idxOfDstPix];
    while ( iRec != NULL ){
        if ( iRec->isUsed ){
            MaxRec *jRec = (MaxRec*)iRec->next;
            while ( jRec != NULL ){
               if ( jRec->isUsed ){
                   int result = compareTwoVecsOfMaxs( iRec, jRec );
                   if ( result != 3 ){
                       printf( "IS BAD: idxOfDstPix=%6d result=%d cnt=%2d  --->  ", idxOfDstPix, result, cnt );
                       printVals( iRec->vals, iRec->numVals, numDistMaxs );
                       printVals( jRec->vals, jRec->numVals, numDistMaxs );
                       printf( "\n" );
                   }
               }
               jRec = (MaxRec*)jRec->next;
            }
        }
        iRec = (MaxRec*)iRec->next;
    }
    #endif

}